

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

int __thiscall AES256CBCDecrypt::Decrypt(AES256CBCDecrypt *this,uchar *data,int size,uchar *out)

{
  int iVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  AES256Decrypt *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe0;
  uchar *iv;
  
  iv = *(uchar **)(in_FS_OFFSET + 0x28);
  iVar1 = CBCDecrypt<AES256Decrypt>
                    (unaff_retaddr,iv,in_RDI,(int)((ulong)in_RSI >> 0x20),
                     SUB81((ulong)in_RSI >> 0x18,0),
                     (uchar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (*(uchar **)(in_FS_OFFSET + 0x28) == iv) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int AES256CBCDecrypt::Decrypt(const unsigned char* data, int size, unsigned char* out) const
{
    return CBCDecrypt(dec, iv, data, size, pad, out);
}